

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::String::Replace(String *this,int pos,int len,char *s,uchar fill)

{
  int iVar1;
  size_t sVar2;
  int local_6c;
  String local_50;
  int local_3c;
  undefined1 local_38 [4];
  int q;
  tagbstring t;
  uchar fill_local;
  char *s_local;
  int len_local;
  int pos_local;
  String *this_local;
  
  t.data._7_1_ = fill;
  if ((this->super_tagbstring).mlen < 1) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x4a7,"Write protection error");
  }
  if ((s != (char *)0x0) && (-1 < (pos | len))) {
    if (pos + len < (this->super_tagbstring).slen) {
      if ((uint)((int)(this->super_tagbstring).data - (int)s) < (uint)(this->super_tagbstring).slen)
      {
        String(&local_50,s);
        Replace(this,pos,len,&local_50,t.data._7_1_);
        ~String(&local_50);
      }
      else {
        sVar2 = strlen(s);
        local_3c = (int)sVar2;
        if ((local_3c <= len) ||
           (Alloc(this,((this->super_tagbstring).slen + local_3c) - len),
           (this->super_tagbstring).data != (uchar *)0x0)) {
          if (local_3c != len) {
            memmove((this->super_tagbstring).data + (long)local_3c + (long)pos,
                    (this->super_tagbstring).data + (long)len + (long)pos,
                    (long)((this->super_tagbstring).slen - (pos + len)));
          }
          memcpy((this->super_tagbstring).data + pos,s,(long)local_3c);
          (this->super_tagbstring).slen = (local_3c - len) + (this->super_tagbstring).slen;
          (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
        }
      }
    }
    else {
      t._0_8_ = s;
      if (s == (char *)0x0) {
        local_6c = 0;
      }
      else {
        sVar2 = strlen(s);
        local_6c = (int)sVar2;
      }
      q = local_6c;
      local_38 = (undefined1  [4])0xffffffff;
      iVar1 = bsetstr(&this->super_tagbstring,pos,(bstring)local_38,t.data._7_1_);
      if (iVar1 == -1) {
        fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
                "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
                ,0x4af,"Failure in Replace");
      }
      else if (pos + q < (this->super_tagbstring).slen) {
        (this->super_tagbstring).slen = pos + q;
        (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
      }
    }
  }
  return;
}

Assistant:

void String::Replace(int pos, int len, const char * s, unsigned char fill)
    {
        struct tagbstring t;
        int q;

        if (mlen <= 0)                        bstringThrow("Write protection error");
        if (NULL == s || (pos | len) < 0)    return;


        if (pos + len >= slen)
        {
            cstr2tbstr(t, s);
            if (BSTR_ERR == bsetstr(this, pos, &t, fill))
                bstringThrow("Failure in Replace");
            else if (pos + t.slen < slen)
            {
                slen = pos + t.slen;
                data[slen] = '\0';
            }
        }
        else
        {
            /* Aliasing case */
            if ((unsigned int)(data - (uint8 * ) s) < (unsigned int) slen)
            {
                Replace(pos, len, String(s), fill);
                return;
            }

            if ((q = (int)strlen(s)) > len)
            {
                Alloc(slen + q - len);
                if (NULL == data)    return;
            }
            if (q != len) memmove(data + pos + q, data + pos + len, slen - (pos + len));
            memcpy(data + pos, s, q);
            slen += q - len;
            data[slen] = '\0';
        }
    }